

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::UpdateColumn
          (RowGroupCollection *this,TransactionData transaction,Vector *row_ids,
          vector<unsigned_long,_true> *column_path,DataChunk *updates)

{
  idx_t row_number;
  idx_t i;
  const_reference pvVar1;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  ColumnStatistics *this_02;
  BaseStatistics *other;
  NotImplementedException *this_03;
  TableStatistics *lock_00;
  allocator local_51;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  lock;
  
  row_number = *(idx_t *)row_ids->data;
  if ((long)row_number < 0x7ffffffffff080) {
    pvVar1 = vector<unsigned_long,_true>::get<true>(column_path,0);
    i = *pvVar1;
    this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
    this_01 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                        (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,row_number);
    RowGroup::UpdateColumn(this_01,transaction,updates,row_ids,column_path);
    lock_00 = &this->stats;
    TableStatistics::GetLock((TableStatistics *)&lock);
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
    ::operator*(&lock);
    this_02 = TableStatistics::GetStats(&this->stats,(TableStatisticsLock *)lock_00,i);
    other = ColumnStatistics::Statistics(this_02);
    RowGroup::MergeIntoStatistics(this_01,i,other);
    ::std::
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>::
    ~unique_ptr(&lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
    return;
  }
  this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&lock,"Cannot update a column-path on transaction local data",&local_51);
  NotImplementedException::NotImplementedException(this_03,(string *)&lock);
  __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void RowGroupCollection::Fetch(TransactionData transaction, DataChunk &result, const vector<StorageIndex> &column_ids,
                               const Vector &row_identifiers, idx_t fetch_count, ColumnFetchState &state) {
	// figure out which row_group to fetch from
	auto row_ids = FlatVector::GetData<row_t>(row_identifiers);
	idx_t count = 0;
	for (idx_t i = 0; i < fetch_count; i++) {
		auto row_id = row_ids[i];
		RowGroup *row_group;
		{
			idx_t segment_index;
			auto l = row_groups->Lock();
			if (!row_groups->TryGetSegmentIndex(l, UnsafeNumericCast<idx_t>(row_id), segment_index)) {
				// in parallel append scenarios it is possible for the row_id
				continue;
			}
			row_group = row_groups->GetSegmentByIndex(l, UnsafeNumericCast<int64_t>(segment_index));
		}
		if (!row_group->Fetch(transaction, UnsafeNumericCast<idx_t>(row_id) - row_group->start)) {
			continue;
		}
		row_group->FetchRow(transaction, state, column_ids, row_id, result, count);
		count++;
	}
	result.SetCardinality(count);
}